

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcRec3.c
# Opt level: O0

void Lms_GiaPrintSubgraph(Gia_Man_t *p,Gia_Obj_t *pObj)

{
  int iVar1;
  Gia_Obj_t *pGVar2;
  Gia_Obj_t *pObj_local;
  Gia_Man_t *p_local;
  
  iVar1 = Gia_ObjIsCo(pObj);
  if (iVar1 != 0) {
    pGVar2 = Gia_ObjFanin0(pObj);
    iVar1 = Gia_ObjIsAnd(pGVar2);
    if (iVar1 == 0) {
      pGVar2 = Gia_ObjFanin0(pObj);
      Gia_ObjPrint(p,pGVar2);
    }
    else {
      pGVar2 = Gia_ObjFanin0(pObj);
      Lms_ObjAreaMark_rec(pGVar2);
      pGVar2 = Gia_ObjFanin0(pObj);
      Lms_GiaPrintSubgraph_rec(p,pGVar2);
    }
    Gia_ObjPrint(p,pObj);
    return;
  }
  __assert_fail("Gia_ObjIsCo(pObj)",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcRec3.c"
                ,0x11b,"void Lms_GiaPrintSubgraph(Gia_Man_t *, Gia_Obj_t *)");
}

Assistant:

void Lms_GiaPrintSubgraph( Gia_Man_t * p, Gia_Obj_t * pObj )
{
    assert( Gia_ObjIsCo(pObj) );
    if ( Gia_ObjIsAnd(Gia_ObjFanin0(pObj)) )
    {
        Lms_ObjAreaMark_rec( Gia_ObjFanin0(pObj) );
        Lms_GiaPrintSubgraph_rec( p, Gia_ObjFanin0(pObj) ); 
    }
    else
        Gia_ObjPrint( p, Gia_ObjFanin0(pObj) );
    Gia_ObjPrint( p, pObj );
}